

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O1

void * ipasir_init(void)

{
  SimpSolver *this;
  
  this = (SimpSolver *)operator_new(0x1560);
  Minisat::SimpSolver::SimpSolver(this);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__IPAsirMiniSAT_00138ce0;
  this[1].super_Solver.drup_file = (FILE *)0x0;
  this[1].super_Solver.reparsed_options = false;
  *(undefined8 *)&this[1].super_Solver.status_every = 0;
  (this->super_Solver).verbosity = 0;
  this[1].super_Solver._vptr_Solver = (_func_int **)0x0;
  this[1].super_Solver.model.data = (lbool *)0x0;
  this[1].super_Solver.model.sz = 0;
  this[1].super_Solver.model.cap = 0;
  this[1].super_Solver.conflict.data = (Lit *)0x0;
  this[1].super_Solver.conflict.sz = 0;
  return this;
}

Assistant:

void *ipasir_init() { return new IPAsirMiniSAT(); }